

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v6::internal::bigint::subtract_aligned(bigint *this,bigint *other)

{
  uint *puVar1;
  size_t sVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  ulong uVar8;
  
  uVar4 = other->exp_ - this->exp_;
  puVar1 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
  sVar2 = (other->bigits_).super_buffer<unsigned_int>.size_;
  puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  uVar5 = 0;
  for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
    uVar8 = uVar4 + sVar7 & 0xffffffff;
    lVar6 = (ulong)puVar3[uVar8] - ((ulong)uVar5 + (ulong)puVar1[sVar7]);
    puVar3[uVar8] = (uint)lVar6;
    uVar5 = (uint)((ulong)lVar6 >> 0x3f);
  }
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  uVar4 = uVar4 + (int)sVar7;
  while (uVar5 != 0) {
    lVar6 = (ulong)puVar1[uVar4] - (ulong)uVar5;
    puVar1[uVar4] = (uint)lVar6;
    uVar5 = (uint)((ulong)lVar6 >> 0x3f);
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j) {
      subtract_bigits(i, other.bigits_[j], borrow);
    }
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }